

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O2

aiMaterial * __thiscall Assimp::IrrlichtBase::ParseMaterial(IrrlichtBase *this,uint *matFlags)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  aiMaterial *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Logger *pLVar4;
  uint uVar5;
  char *pKey;
  uint index;
  int local_4bc;
  float f;
  undefined4 uStack_4ac;
  size_type local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  ulong local_470;
  int op;
  undefined4 uStack_464;
  aiColor4D clr;
  aiString s;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  s.length = 0;
  clr.r = 0.0;
  clr.g = 0.0;
  clr.b = 0.0;
  clr.a = 0.0;
  s.data[0] = '\0';
  memset(s.data + 1,0x1b,0x3ff);
  *matFlags = 0;
  local_4bc = 0;
  local_470 = 0;
LAB_003a8c7c:
  while( true ) {
    iVar3 = (*this->reader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar3 == '\0') {
      pLVar4 = DefaultLogger::get();
      Logger::error(pLVar4,"IRRMESH: Unexpected end of file. Material is not complete");
      return this_00;
    }
    iVar3 = (*this->reader->_vptr_IIrrXMLReader[3])();
    if (iVar3 == 1) break;
    if (iVar3 == 2) {
      iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar3),"material");
      if (iVar3 == 0) goto LAB_003a96ef;
      iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_00,iVar3),"attributes");
      if (iVar3 == 0) {
LAB_003a96ef:
        if ((local_4bc != 0) && (uVar5 = *matFlags, (uVar5 & 2) != 0)) {
          f = 1.0;
          op = uVar5 >> 7 & 1;
          if ((uVar5 & 0x24) == 0) {
            if ((uVar5 & 0x48) != 0) {
              f = 4.0;
            }
          }
          else {
            f = 2.0;
          }
          aiMaterial::AddProperty(this_00,&f,1,"$tex.blend",10,0);
          aiMaterial::AddProperty(this_00,&op,1,"$tex.op",10,0);
        }
        return this_00;
      }
    }
  }
  iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
  iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_01,iVar3),"color");
  if (iVar3 == 0) {
    local_4a8 = 0;
    local_4a0._M_local_buf[0] = '\0';
    _f = (pointer)&local_4a0;
    ReadHexProperty(this,(HexProperty *)&f);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            "Diffuse");
    pKey = "$clr.diffuse";
    if (bVar2) {
LAB_003a8e77:
      ColorFromARGBPacked((uint32_t)local_490._M_dataplus._M_p,&clr);
      aiMaterial::AddProperty(this_00,&clr,1,pKey,0,0);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,"Ambient");
      pKey = "$clr.ambient";
      if (bVar2) goto LAB_003a8e77;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,"Specular");
      pKey = "$clr.specular";
      if (bVar2) goto LAB_003a8e77;
    }
    std::__cxx11::string::~string((string *)&f);
    goto LAB_003a8c7c;
  }
  iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
  iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_02,iVar3),"float");
  if (iVar3 == 0) {
    local_4a8 = 0;
    local_4a0._M_local_buf[0] = '\0';
    _f = (pointer)&local_4a0;
    ReadFloatProperty(this,(FloatProperty *)&f);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            "Shininess");
    if (bVar2) {
      aiMaterial::AddProperty(this_00,(float *)&local_490,1,"$mat.shininess",0,0);
    }
  }
  else {
    iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_03,iVar3),"bool");
    if (iVar3 != 0) {
      iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_04,iVar3),"texture");
      if (iVar3 != 0) {
        iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_05,iVar3),"enum");
        if (iVar3 != 0) goto LAB_003a8c7c;
      }
      local_4a8 = 0;
      local_4a0._M_local_buf[0] = '\0';
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      local_490._M_string_length = 0;
      local_490.field_2._M_local_buf[0] = '\0';
      _f = (pointer)&local_4a0;
      ReadStringProperty(this,(Property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&f);
      if (local_490._M_string_length != 0) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&f,"Type");
        if ((bVar2) && (bVar2 = std::operator==(&local_490,"solid"), !bVar2)) {
          bVar2 = std::operator==(&local_490,"trans_vertex_alpha");
          if (bVar2) {
            *matFlags = 1;
          }
          else {
            bVar2 = std::operator==(&local_490,"lightmap");
            if (bVar2) {
              *matFlags = 2;
            }
            else {
              bVar2 = std::operator==(&local_490,"solid_2layer");
              if (bVar2) {
                *matFlags = 0x10000;
              }
              else {
                bVar2 = std::operator==(&local_490,"lightmap_m2");
                if (bVar2) {
                  *matFlags = 6;
                }
                else {
                  bVar2 = std::operator==(&local_490,"lightmap_m4");
                  if (bVar2) {
                    *matFlags = 10;
                  }
                  else {
                    bVar2 = std::operator==(&local_490,"lightmap_light");
                    if (bVar2) {
                      *matFlags = 0x12;
                    }
                    else {
                      bVar2 = std::operator==(&local_490,"lightmap_light_m2");
                      if (bVar2) {
                        *matFlags = 0x22;
                      }
                      else {
                        bVar2 = std::operator==(&local_490,"lightmap_light_m4");
                        if (bVar2) {
                          *matFlags = 0x42;
                        }
                        else {
                          bVar2 = std::operator==(&local_490,"lightmap_add");
                          if (bVar2) {
                            *matFlags = 0x82;
                          }
                          else {
                            bVar2 = std::operator==(&local_490,"normalmap_solid");
                            if ((bVar2) ||
                               (bVar2 = std::operator==(&local_490,"parallaxmap_solid"), bVar2)) {
                              *matFlags = 0x100;
                            }
                            else {
                              bVar2 = std::operator==(&local_490,"normalmap_trans_vertex_alpha");
                              if ((bVar2) ||
                                 (bVar2 = std::operator==(&local_490,
                                                          "parallaxmap_trans_vertex_alpha"), bVar2))
                              {
                                *matFlags = 0x101;
                              }
                              else {
                                bVar2 = std::operator==(&local_490,"normalmap_trans_add");
                                if ((bVar2) ||
                                   (bVar2 = std::operator==(&local_490,"parallaxmap_trans_add"),
                                   bVar2)) {
                                  *matFlags = 0x102;
                                }
                                else {
                                  pLVar4 = DefaultLogger::get();
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&op,"IRRMat: Unrecognized material type: ",
                                                 &local_490);
                                  Logger::warn(pLVar4,(char *)CONCAT44(uStack_464,op));
                                  std::__cxx11::string::~string((string *)&op);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&f,"Texture1");
        sVar1 = local_490._M_string_length;
        if (bVar2) {
          if (local_490._M_string_length < 0x400) {
            s.length = (ai_uint32)local_490._M_string_length;
            memcpy(s.data,local_490._M_dataplus._M_p,local_490._M_string_length);
            s.data[sVar1] = '\0';
          }
          aiMaterial::AddProperty(this_00,&s,"$tex.file",1,0);
          local_4bc = local_4bc + 1;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&f,"Texture2");
          sVar1 = local_490._M_string_length;
          if (local_4bc == 1 && bVar2) {
            uVar5 = *matFlags;
            if ((uVar5 & 2) == 0) {
              if ((uVar5 >> 8 & 1) != 0) {
                uVar5 = 6;
                goto LAB_003a9319;
              }
              if ((uVar5 >> 0x10 & 1) == 0) {
                pLVar4 = DefaultLogger::get();
                Logger::warn(pLVar4,"IRRmat: Skipping second texture");
                local_4bc = 1;
                goto LAB_003a9379;
              }
              if (local_490._M_string_length < 0x400) {
                s.length = (ai_uint32)local_490._M_string_length;
                memcpy(s.data,local_490._M_dataplus._M_p,local_490._M_string_length);
                s.data[sVar1] = '\0';
              }
              aiMaterial::AddProperty(this_00,&s,"$tex.file",1,1);
              local_470 = (ulong)((int)local_470 + 1);
            }
            else {
              uVar5 = 10;
LAB_003a9319:
              if (local_490._M_string_length < 0x400) {
                s.length = (ai_uint32)local_490._M_string_length;
                memcpy(s.data,local_490._M_dataplus._M_p,local_490._M_string_length);
                s.data[sVar1] = '\0';
              }
              aiMaterial::AddProperty(this_00,&s,"$tex.file",uVar5,0);
            }
            *(byte *)((long)matFlags + 2) = *(byte *)((long)matFlags + 2) | 0x10;
            local_4bc = 2;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&f,"Texture3");
            sVar1 = local_490._M_string_length;
            if (local_4bc == 2 && bVar2) {
              if (local_490._M_string_length < 0x400) {
                s.length = (ai_uint32)local_490._M_string_length;
                memcpy(s.data,local_490._M_dataplus._M_p,local_490._M_string_length);
                s.data[sVar1] = '\0';
              }
              aiMaterial::AddProperty(this_00,&s,"$tex.file",1,(int)local_470 + 1);
              local_4bc = 3;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&f,"Texture4");
              sVar1 = local_490._M_string_length;
              if (local_4bc == 3 && bVar2) {
                if (local_490._M_string_length < 0x400) {
                  s.length = (ai_uint32)local_490._M_string_length;
                  memcpy(s.data,local_490._M_dataplus._M_p,local_490._M_string_length);
                  s.data[sVar1] = '\0';
                }
                aiMaterial::AddProperty(this_00,&s,"$tex.file",1,(int)local_470 + 2);
                local_4bc = 4;
              }
            }
          }
        }
LAB_003a9379:
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&f,"TextureWrap1");
        if (0 < local_4bc && bVar2) {
          op = ConvertMappingMode(&local_490);
          aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodeu",1,0);
          aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodev",1,0);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&f,"TextureWrap2");
          if (1 < local_4bc && bVar2) {
            op = ConvertMappingMode(&local_490);
            uVar5 = *matFlags;
            if ((uVar5 & 2) == 0) {
              if ((uVar5 >> 8 & 1) == 0) {
                if ((uVar5 >> 0x10 & 1) == 0) goto LAB_003a95ab;
                aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodeu",1,1);
                uVar5 = 1;
                index = 1;
              }
              else {
                aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodeu",6,0);
                index = 0;
                uVar5 = 6;
              }
            }
            else {
              aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodeu",10,0);
              index = 0;
              uVar5 = 10;
            }
            aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodev",uVar5,index);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&f,"TextureWrap3");
            if (2 < local_4bc && bVar2) {
              op = ConvertMappingMode(&local_490);
              uVar5 = (int)local_470 + 1;
              aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodeu",1,uVar5);
              aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodev",1,uVar5);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&f,"TextureWrap4");
              if (3 < local_4bc && bVar2) {
                op = ConvertMappingMode(&local_490);
                uVar5 = (int)local_470 + 2;
                aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodeu",1,uVar5);
                aiMaterial::AddProperty(this_00,&op,1,"$tex.mapmodev",1,uVar5);
              }
            }
          }
        }
      }
LAB_003a95ab:
      Property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Property((Property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&f);
      goto LAB_003a8c7c;
    }
    local_4a8 = 0;
    local_4a0._M_local_buf[0] = '\0';
    _f = (pointer)&local_4a0;
    ReadBoolProperty(this,(BoolProperty *)&f);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            "Wireframe");
    if (bVar2) {
      op = (int)(byte)local_490._M_dataplus._M_p;
      aiMaterial::AddProperty(this_00,&op,1,"$mat.wireframe",0,0);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,"GouraudShading");
      if (bVar2) {
        op = 9;
        if ((byte)local_490._M_dataplus._M_p != '\0') {
          op = 2;
        }
        aiMaterial::AddProperty(this_00,&op,1,"$mat.shadingm",0,0);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&f,"BackfaceCulling");
        if (bVar2) {
          op = (byte)local_490._M_dataplus._M_p ^ 1;
          aiMaterial::AddProperty(this_00,&op,1,"$mat.twosided",0,0);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&f);
  goto LAB_003a8c7c;
}

Assistant:

aiMaterial* IrrlichtBase::ParseMaterial(unsigned int& matFlags)
{
    aiMaterial* mat = new aiMaterial();
    aiColor4D clr;
    aiString s;

    matFlags = 0; // zero output flags
    int cnt  = 0; // number of used texture channels
    unsigned int nd = 0;

    // Continue reading from the file
    while (reader->read())
    {
        switch (reader->getNodeType())
        {
        case EXN_ELEMENT:

            // Hex properties
            if (!ASSIMP_stricmp(reader->getNodeName(),"color"))
            {
                HexProperty prop;
                ReadHexProperty(prop);
                if (prop.name == "Diffuse")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
                }
                else if (prop.name == "Ambient")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_AMBIENT);
                }
                else if (prop.name == "Specular")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_SPECULAR);
                }

                // NOTE: The 'emissive' property causes problems. It is
                // often != 0, even if there is obviously no light
                // emitted by the described surface. In fact I think
                // IRRLICHT ignores this property, too.
#if 0
                else if (prop.name == "Emissive")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_EMISSIVE);
                }
#endif
            }
            // Float properties
            else if (!ASSIMP_stricmp(reader->getNodeName(),"float"))
            {
                FloatProperty prop;
                ReadFloatProperty(prop);
                if (prop.name == "Shininess")
                {
                    mat->AddProperty(&prop.value,1,AI_MATKEY_SHININESS);
                }
            }
            // Bool properties
            else if (!ASSIMP_stricmp(reader->getNodeName(),"bool"))
            {
                BoolProperty prop;
                ReadBoolProperty(prop);
                if (prop.name == "Wireframe")
                {
                    int val = (prop.value ? true : false);
                    mat->AddProperty(&val,1,AI_MATKEY_ENABLE_WIREFRAME);
                }
                else if (prop.name == "GouraudShading")
                {
                    int val = (prop.value ? aiShadingMode_Gouraud
                        : aiShadingMode_NoShading);
                    mat->AddProperty(&val,1,AI_MATKEY_SHADING_MODEL);
                }
                else if (prop.name == "BackfaceCulling")
                {
                    int val = (!prop.value);
                    mat->AddProperty(&val,1,AI_MATKEY_TWOSIDED);
                }
            }
            // String properties - textures and texture related properties
            else if (!ASSIMP_stricmp(reader->getNodeName(),"texture") ||
                     !ASSIMP_stricmp(reader->getNodeName(),"enum"))
            {
                StringProperty prop;
                ReadStringProperty(prop);
                if (prop.value.length())
                {
                    // material type (shader)
                    if (prop.name == "Type")
                    {
                        if (prop.value == "solid")
                        {
                            // default material ...
                        }
                        else if (prop.value == "trans_vertex_alpha")
                        {
                            matFlags = AI_IRRMESH_MAT_trans_vertex_alpha;
                        }
                        else if (prop.value == "lightmap")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap;
                        }
                        else if (prop.value == "solid_2layer")
                        {
                            matFlags = AI_IRRMESH_MAT_solid_2layer;
                        }
                        else if (prop.value == "lightmap_m2")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_m2;
                        }
                        else if (prop.value == "lightmap_m4")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_m4;
                        }
                        else if (prop.value == "lightmap_light")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_light;
                        }
                        else if (prop.value == "lightmap_light_m2")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_light_m2;
                        }
                        else if (prop.value == "lightmap_light_m4")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_light_m4;
                        }
                        else if (prop.value == "lightmap_add")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_add;
                        }
                        // Normal and parallax maps are treated equally
                        else if (prop.value == "normalmap_solid" ||
                            prop.value == "parallaxmap_solid")
                        {
                            matFlags = AI_IRRMESH_MAT_normalmap_solid;
                        }
                        else if (prop.value == "normalmap_trans_vertex_alpha" ||
                            prop.value == "parallaxmap_trans_vertex_alpha")
                        {
                            matFlags = AI_IRRMESH_MAT_normalmap_tva;
                        }
                        else if (prop.value == "normalmap_trans_add" ||
                            prop.value == "parallaxmap_trans_add")
                        {
                            matFlags = AI_IRRMESH_MAT_normalmap_ta;
                        }
                        else {
                            ASSIMP_LOG_WARN("IRRMat: Unrecognized material type: " + prop.value);
                        }
                    }

                    // Up to 4 texture channels are supported
                    if (prop.name == "Texture1")
                    {
                        // Always accept the primary texture channel
                        ++cnt;
                        s.Set(prop.value);
                        mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
                    }
                    else if (prop.name == "Texture2" && cnt == 1)
                    {
                        // 2-layer material lightmapped?
                        if (matFlags & AI_IRRMESH_MAT_lightmap) {
                            ++cnt;
                            s.Set(prop.value);
                            mat->AddProperty(&s,AI_MATKEY_TEXTURE_LIGHTMAP(0));

                            // set the corresponding material flag
                            matFlags |= AI_IRRMESH_EXTRA_2ND_TEXTURE;
                        }
                        // alternatively: normal or parallax mapping
                        else if (matFlags & AI_IRRMESH_MAT_normalmap_solid) {
                            ++cnt;
                            s.Set(prop.value);
                            mat->AddProperty(&s,AI_MATKEY_TEXTURE_NORMALS(0));

                            // set the corresponding material flag
                            matFlags |= AI_IRRMESH_EXTRA_2ND_TEXTURE;
                        } else if (matFlags & AI_IRRMESH_MAT_solid_2layer)    {// or just as second diffuse texture
                            ++cnt;
                            s.Set(prop.value);
                            mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(1));
                            ++nd;

                            // set the corresponding material flag
                            matFlags |= AI_IRRMESH_EXTRA_2ND_TEXTURE;
                        } else {
                            ASSIMP_LOG_WARN("IRRmat: Skipping second texture");
                        }
                    } else if (prop.name == "Texture3" && cnt == 2) {
                        // Irrlicht does not seem to use these channels.
                        ++cnt;
                        s.Set(prop.value);
                        mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(nd+1));
                    } else if (prop.name == "Texture4" && cnt == 3) {
                        // Irrlicht does not seem to use these channels.
                        ++cnt;
                        s.Set(prop.value);
                        mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(nd+2));
                    }

                    // Texture mapping options
                    if (prop.name == "TextureWrap1" && cnt >= 1)
                    {
                        int map = ConvertMappingMode(prop.value);
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0));
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0));
                    }
                    else if (prop.name == "TextureWrap2" && cnt >= 2)
                    {
                        int map = ConvertMappingMode(prop.value);
                        if (matFlags & AI_IRRMESH_MAT_lightmap) {
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_LIGHTMAP(0));
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_LIGHTMAP(0));
                        }
                        else if (matFlags & (AI_IRRMESH_MAT_normalmap_solid)) {
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_NORMALS(0));
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_NORMALS(0));
                        }
                        else if (matFlags & AI_IRRMESH_MAT_solid_2layer) {
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(1));
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(1));
                        }
                    }
                    else if (prop.name == "TextureWrap3" && cnt >= 3)
                    {
                        int map = ConvertMappingMode(prop.value);
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(nd+1));
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(nd+1));
                    }
                    else if (prop.name == "TextureWrap4" && cnt >= 4)
                    {
                        int map = ConvertMappingMode(prop.value);
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(nd+2));
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(nd+2));
                    }
                }
            }
            break;
            case EXN_ELEMENT_END:

                /* Assume there are no further nested nodes in <material> elements
                 */
                if (/* IRRMESH */ !ASSIMP_stricmp(reader->getNodeName(),"material") ||
                    /* IRR     */ !ASSIMP_stricmp(reader->getNodeName(),"attributes"))
                {
                    // Now process lightmapping flags
                    // We should have at least one textur to do that ..
                    if (cnt && matFlags & AI_IRRMESH_MAT_lightmap)
                    {
                        float f = 1.f;
                        unsigned int unmasked = matFlags&~AI_IRRMESH_MAT_lightmap;

                        // Additive lightmap?
                        int op = (unmasked & AI_IRRMESH_MAT_lightmap_add
                            ? aiTextureOp_Add : aiTextureOp_Multiply);

                        // Handle Irrlicht's lightmapping scaling factor
                        if (unmasked & AI_IRRMESH_MAT_lightmap_m2 ||
                            unmasked & AI_IRRMESH_MAT_lightmap_light_m2)
                        {
                            f = 2.f;
                        }
                        else if (unmasked & AI_IRRMESH_MAT_lightmap_m4 ||
                            unmasked & AI_IRRMESH_MAT_lightmap_light_m4)
                        {
                            f = 4.f;
                        }
                        mat->AddProperty( &f, 1, AI_MATKEY_TEXBLEND_LIGHTMAP(0));
                        mat->AddProperty( &op,1, AI_MATKEY_TEXOP_LIGHTMAP(0));
                    }

                    return mat;
                }
            default:

                // GCC complains here ...
                break;
        }
    }
    ASSIMP_LOG_ERROR("IRRMESH: Unexpected end of file. Material is not complete");

    return mat;
}